

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O1

void __thiscall
BGIP_SolverCE::UpdateCEProbDistribution
          (BGIP_SolverCE *this,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *Xi,list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *best_samples)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  pointer pvVar4;
  long lVar5;
  undefined1 auVar6 [16];
  pointer pvVar7;
  uint uVar8;
  size_type __n;
  size_type __n_00;
  ulong uVar9;
  _List_node_base *p_Var10;
  undefined8 uVar11;
  _List_node_base *p_Var12;
  _Self __tmp;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  uint uVar15;
  ulong uVar16;
  _List_node_base *p_Var17;
  undefined1 auVar18 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  counts;
  allocator_type local_da;
  allocator_type local_d9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_d8;
  _List_node_base *local_c0;
  _List_node_base *local_b8;
  _List_node_base *local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  pointer local_88;
  pointer local_80;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_78;
  long *local_58;
  shared_count asStack_50 [2];
  size_t local_40;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_38;
  
  local_80 = (Xi->
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_88 = (Xi->
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = (_List_node_base *)(((long)local_88 - (long)local_80 >> 3) * -0x5555555555555555);
  local_40 = (best_samples->super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>).
             _M_impl._M_node._M_size;
  local_78.
  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var13 = (best_samples->super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  local_b8 = (_List_node_base *)best_samples;
  local_38 = Xi;
  if (local_88 != local_80) {
    p_Var10 = (_List_node_base *)0x0;
    do {
      lVar2 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                        field_0x10;
      local_d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
      local_d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)
            &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
      if (lVar2 != 0) {
        LOCK();
        piVar1 = (int *)(lVar2 + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      __n = (**(code **)(((local_d8.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start + 10))
                      (local_d8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,p_Var10,0,999999);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_d8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      lVar2 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                        field_0x10;
      local_58 = *(long **)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>)
                            .field_0x8;
      asStack_50[0].pi_ =
           *(sp_counted_base **)
            &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
      if (lVar2 != 0) {
        LOCK();
        piVar1 = (int *)(lVar2 + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      __n_00 = (**(code **)(*local_58 + 0x20))(local_58,p_Var10);
      in_ZMM1._8_56_ = extraout_var;
      in_ZMM1._0_8_ = extraout_XMM1_Qa;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,__n_00,&local_d9);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_d8,__n,&local_a8,&local_da);
      std::
      vector<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
      ::
      emplace_back<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                ((vector<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                  *)&local_78,&local_d8);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_d8);
      if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      boost::detail::shared_count::~shared_count(asStack_50);
      p_Var10 = (_List_node_base *)(ulong)((int)p_Var10 + 1);
    } while (p_Var10 < local_b0);
  }
  while (p_Var13 != local_b8) {
    lVar2 = (long)p_Var13[1]._M_next;
    pvVar7 = *(pointer *)(lVar2 + 0x10);
    local_d8.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar2 + 0x18);
    if (*(long *)(lVar2 + 0x18) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(lVar2 + 0x18) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_d8.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pvVar7;
    local_c0 = p_Var13;
    if (local_88 != local_80) {
      p_Var13 = (_List_node_base *)0x0;
      do {
        uVar15 = 0;
        while( true ) {
          lVar2 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>)
                            .field_0x10;
          local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)
                &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
          local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               *(pointer *)
                &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10
          ;
          if (lVar2 != 0) {
            LOCK();
            piVar1 = (int *)(lVar2 + 8);
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          uVar9 = (**(code **)(*(long *)local_a8.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 0x28))
                            (local_a8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,p_Var13,0,999999);
          in_ZMM1._8_56_ = extraout_var_00;
          in_ZMM1._0_8_ = extraout_XMM1_Qa_00;
          uVar16 = (ulong)uVar15;
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
          if (uVar9 <= uVar16) break;
          plVar3 = *(long **)(pvVar7[4].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish + (long)p_Var13 * 2);
          uVar8 = (**(code **)(*plVar3 + 0x40))(plVar3,uVar16);
          piVar1 = (int *)(*(long *)&local_78.
                                     super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)p_Var13].
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + (ulong)uVar8 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = uVar15 + 1;
        }
        p_Var13 = (_List_node_base *)(ulong)((int)p_Var13 + 1);
      } while (p_Var13 < local_b0);
    }
    p_Var13 = (((_List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)&local_c0->_M_next)
              ->_M_impl)._M_node.super__List_node_base._M_next;
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_d8.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_88 != local_80) {
    auVar6 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,local_40);
    local_b8 = auVar6._0_8_;
    p_Var13 = (_List_node_base *)0x0;
    do {
      uVar15 = 0;
      while( true ) {
        lVar2 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).
                          field_0x10;
        local_d8.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
        local_d8.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10;
        if (lVar2 != 0) {
          LOCK();
          piVar1 = (int *)(lVar2 + 8);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        p_Var10 = (_List_node_base *)
                  (**(code **)(((local_d8.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start + 10))
                            (local_d8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,p_Var13,0,999999);
        p_Var14 = (_List_node_base *)(ulong)uVar15;
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_d8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        if (p_Var10 <= p_Var14) break;
        uVar15 = 0;
        local_c0 = p_Var14;
        while( true ) {
          lVar2 = *(long *)&(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>)
                            .field_0x10;
          local_d8.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)
                &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x8;
          local_d8.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)
                &(this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>).field_0x10
          ;
          if (lVar2 != 0) {
            LOCK();
            piVar1 = (int *)(lVar2 + 8);
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          p_Var10 = (_List_node_base *)
                    (**(code **)(((local_d8.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + 8))
                              (local_d8.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,p_Var13);
          p_Var17 = (_List_node_base *)(ulong)uVar15;
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     &local_d8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          if (p_Var10 <= p_Var17) break;
          pvVar4 = (local_38->
                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          p_Var12 = (_List_node_base *)
                    (((long)(local_38->
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                    -0x5555555555555555);
          p_Var10 = p_Var13;
          if (((p_Var12 < p_Var13 || (long)p_Var12 - (long)p_Var13 == 0) ||
              (lVar2 = *(long *)&pvVar4[(long)p_Var13].
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data,
              p_Var12 = (_List_node_base *)
                        (((long)*(pointer *)
                                 ((long)&pvVar4[(long)p_Var13].
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3) *
                        -0x5555555555555555), p_Var10 = local_c0,
              p_Var12 < local_c0 || (long)p_Var12 - (long)local_c0 == 0)) ||
             (lVar5 = *(long *)(lVar2 + (long)p_Var14 * 0x18), p_Var10 = p_Var17,
             (_List_node_base *)(*(long *)(lVar2 + 8 + (long)p_Var14 * 0x18) - lVar5 >> 3) <=
             p_Var17)) {
            uVar11 = std::__throw_out_of_range_fmt
                               ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                ,p_Var10);
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::~vector(&local_d8);
            if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            boost::detail::shared_count::~shared_count(asStack_50);
            std::
            vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
            ::~vector(&local_78);
            _Unwind_Resume(uVar11);
          }
          auVar19 = vcvtusi2sd_avx512f(in_XMM3,*(undefined4 *)
                                                (*(long *)&local_78.
                                                  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)p_Var13].
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)p_Var14].
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data +
                                                (long)p_Var17 * 4));
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(lVar5 + (long)p_Var17 * 8);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = this->_m_alpha * (auVar19._0_8_ / (double)local_b8);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = 1.0 - this->_m_alpha;
          auVar6 = vfmadd231sd_fma(auVar18,auVar19,auVar6);
          *(long *)(lVar5 + (long)p_Var17 * 8) = auVar6._0_8_;
          uVar15 = uVar15 + 1;
        }
        uVar15 = (int)local_c0 + 1;
      }
      p_Var13 = (_List_node_base *)(ulong)((int)p_Var13 + 1);
    } while (p_Var13 < local_b0);
  }
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void UpdateCEProbDistribution(
        std::vector< std::vector< std::vector<double> > >& Xi, 
        const std::list<JPPVValuePair* >& best_samples)
        {
            size_t nrAgents = Xi.size();
            size_t nrSamples = best_samples.size();
            //get counts
            std::vector< std::vector< std::vector< unsigned int > > > counts;
            std::list<JPPVValuePair* >::const_iterator it = best_samples.begin();
            std::list<JPPVValuePair* >::const_iterator last = best_samples.end();
            for(Index agI=0; agI < nrAgents; agI++)    
            {
                size_t nrT =  this->GetBGIPI()->
                    GetNrPolicyDomainElements(agI, TYPE_INDEX);
                counts.push_back( 
                    std::vector< std::vector< unsigned int > >( 
                        nrT, 
                        std::vector<  unsigned int >(this->GetBGIPI()->GetNrActions(agI))
                        )
                    );
            }
            
            while(it != last)
            {
                boost::shared_ptr<JointPolicyPureVector> p_jpol= (*it)->GetJPPV();
                std::vector< PolicyPureVector* > & policies = 
                    p_jpol->GetIndividualPolicies();
                for(Index agI=0; agI < nrAgents; agI++)
                {
                    for(Index typeI=0; typeI < this->GetBGIPI()->
                            GetNrPolicyDomainElements(agI, TYPE_INDEX); typeI++)
                    {
                        Index acI = policies[agI]->GetActionIndex(typeI);
                        counts[agI][typeI][acI]++;
                    }
                }
                it++;
            }
            // update
    
            for(Index agI=0; agI < nrAgents; agI++)
                for(Index typeI=0; typeI < this->GetBGIPI()->
                        GetNrPolicyDomainElements(agI, TYPE_INDEX); typeI++)
                    for(Index acI=0; acI < this->GetBGIPI()->GetNrActions(agI); acI++)
                    {
                        double new_prob = ((double)counts[agI][typeI][acI])/nrSamples;
                        Xi.at(agI).at(typeI).at(acI) = 
                            (1 - _m_alpha)  * Xi.at(agI).at(typeI).at(acI) +
                            _m_alpha * new_prob;
                    }
        }